

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall LowererMD::LowerLeaveNull(LowererMD *this,Instr *finallyEndInstr)

{
  Instr *pIVar1;
  RegNum RVar2;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *pIVar3;
  RegOpnd *pRVar4;
  HelperCallOpnd *src1Opnd;
  IntConstOpnd *newSrc;
  IntConstOpnd *intSrc;
  Instr *push;
  Instr *movTarget;
  Opnd *targetOpnd;
  Instr *movR9;
  Instr *movR8;
  RegOpnd *eaxOpnd;
  RegOpnd *retReg;
  Instr *instr;
  Instr *instrPrev;
  Instr *finallyEndInstr_local;
  LowererMD *this_local;
  
  pIVar1 = finallyEndInstr->m_prev;
  sym = StackSym::New(TyInt64,this->m_func);
  RVar2 = LowererMDArch::GetRegReturn(TyInt64);
  dstOpnd = IR::RegOpnd::New(sym,RVar2,TyInt64,this->m_func);
  pIVar3 = IR::Instr::New(XOR,&dstOpnd->super_Opnd,this->m_func);
  RVar2 = LowererMDArch::GetRegReturn(TyInt64);
  pRVar4 = IR::RegOpnd::New((StackSym *)0x0,RVar2,TyInt64,this->m_func);
  IR::Instr::SetSrc1(pIVar3,&pRVar4->super_Opnd);
  IR::Instr::SetSrc2(pIVar3,&pRVar4->super_Opnd);
  IR::Instr::InsertBefore(finallyEndInstr,pIVar3);
  pRVar4 = IR::RegOpnd::New((StackSym *)0x0,RegArg2,TyInt64,this->m_func);
  pIVar3 = IR::Instr::New(LdSpillSize,&pRVar4->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(finallyEndInstr,pIVar3);
  pRVar4 = IR::RegOpnd::New((StackSym *)0x0,RegArg3,TyInt64,this->m_func);
  pIVar3 = IR::Instr::New(LdArgSize,&pRVar4->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(finallyEndInstr,pIVar3);
  pRVar4 = IR::RegOpnd::New((StackSym *)0x0,RegArg0,TyInt64,this->m_func);
  src1Opnd = IR::HelperCallOpnd::New(HelperOp_ReturnFromCallWithFakeFrame,this->m_func);
  pIVar3 = IR::Instr::New(MOV,&pRVar4->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(finallyEndInstr,pIVar3);
  pIVar3 = IR::Instr::New(PUSH,this->m_func);
  IR::Instr::SetSrc1(pIVar3,&pRVar4->super_Opnd);
  IR::Instr::InsertBefore(finallyEndInstr,pIVar3);
  newSrc = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  pIVar3 = IR::Instr::New(RET,this->m_func);
  IR::Instr::SetSrc1(pIVar3,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(pIVar3,&dstOpnd->super_Opnd);
  IR::Instr::InsertBefore(finallyEndInstr,pIVar3);
  IR::Instr::Remove(finallyEndInstr);
  return pIVar1;
}

Assistant:

IR::Instr *
LowererMD::LowerLeaveNull(IR::Instr *finallyEndInstr)
{
    IR::Instr *instrPrev = finallyEndInstr->m_prev;
    IR::Instr *instr     = nullptr;

    // Return a null continuation address to the helper: execution will resume at the point determined by the try
    // or the exception handler.
    IR::RegOpnd *retReg = IR::RegOpnd::New(StackSym::New(TyMachReg,this->m_func), lowererMDArch.GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    instr = IR::Instr::New(Js::OpCode::XOR, retReg, this->m_func);
    IR::RegOpnd *eaxOpnd = IR::RegOpnd::New(nullptr, lowererMDArch.GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    instr->SetSrc1(eaxOpnd);
    instr->SetSrc2(eaxOpnd);
    finallyEndInstr->InsertBefore(instr);

#if _M_X64
    {
        // amd64_ReturnFromCallWithFakeFrame expects to find the spill size and args size
        // in REG_EH_SPILL_SIZE and REG_EH_ARGS_SIZE.

        // MOV REG_EH_SPILL_SIZE, spillSize
        IR::Instr *movR8 = IR::Instr::New(Js::OpCode::LdSpillSize,
                                          IR::RegOpnd::New(nullptr, REG_EH_SPILL_SIZE, TyMachReg, m_func),
                                          m_func);
        finallyEndInstr->InsertBefore(movR8);

        // MOV REG_EH_ARGS_SIZE, argsSize
        IR::Instr *movR9 = IR::Instr::New(Js::OpCode::LdArgSize,
                                          IR::RegOpnd::New(nullptr, REG_EH_ARGS_SIZE, TyMachReg, m_func),
                                          m_func);
        finallyEndInstr->InsertBefore(movR9);

        IR::Opnd *targetOpnd = IR::RegOpnd::New(nullptr, REG_EH_TARGET, TyMachReg, m_func);
        IR::Instr *movTarget = IR::Instr::New(Js::OpCode::MOV,
            targetOpnd,
            IR::HelperCallOpnd::New(IR::HelperOp_ReturnFromCallWithFakeFrame, m_func),
            m_func);
        finallyEndInstr->InsertBefore(movTarget);

        IR::Instr *push = IR::Instr::New(Js::OpCode::PUSH, m_func);
        push->SetSrc1(targetOpnd);
        finallyEndInstr->InsertBefore(push);
    }
#endif

    IR::IntConstOpnd *intSrc = IR::IntConstOpnd::New(0, TyInt32, this->m_func);
    instr = IR::Instr::New(Js::OpCode::RET, this->m_func);
    instr->SetSrc1(intSrc);
    instr->SetSrc2(retReg);
    finallyEndInstr->InsertBefore(instr);
    finallyEndInstr->Remove();

    return instrPrev;
}